

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_LZWDecoder.cc
# Opt level: O1

void __thiscall Pl_LZWDecoder::handleCode(Pl_LZWDecoder *this,uint code)

{
  Buffer *this_00;
  pointer pBVar1;
  pointer pBVar2;
  Pipeline *pPVar3;
  uchar c;
  uchar *puVar4;
  size_t sVar5;
  runtime_error *this_01;
  uint code_00;
  uint uVar6;
  int iVar7;
  pointer this_02;
  ulong i;
  uchar ch;
  uchar local_29;
  
  if (this->eod == false) {
    if (code == 0x101) {
      this->eod = true;
    }
    else if (code == 0x100) {
      pBVar1 = (this->table).super__Vector_base<Buffer,_std::allocator<Buffer>_>._M_impl.
               super__Vector_impl_data._M_start;
      pBVar2 = (this->table).super__Vector_base<Buffer,_std::allocator<Buffer>_>._M_impl.
               super__Vector_impl_data._M_finish;
      this_02 = pBVar1;
      if (pBVar1 != pBVar2) {
        do {
          Buffer::~Buffer(this_02);
          this_02 = this_02 + 1;
        } while (this_02 != pBVar2);
        (this->table).super__Vector_base<Buffer,_std::allocator<Buffer>_>._M_impl.
        super__Vector_impl_data._M_finish = pBVar1;
      }
      this->code_size = 9;
    }
    else {
      if (this->last_code != 0x100) {
        i = (long)(this->table).super__Vector_base<Buffer,_std::allocator<Buffer>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->table).super__Vector_base<Buffer,_std::allocator<Buffer>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
        if (i >> 0x20 != 0) {
          QIntC::IntConverter<unsigned_long,_unsigned_int,_false,_false>::error(i);
        }
        uVar6 = (uint)i;
        c = (uchar)code;
        if (0xff < code) {
          if (uVar6 < code - 0x102) {
            this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_01,"LZWDecoder: bad code received");
            goto LAB_00138ee4;
          }
          code_00 = code;
          if (code - 0x102 == uVar6) {
            code_00 = this->last_code;
          }
          c = getFirstChar(this,code_00);
        }
        if (uVar6 + 0x102 == 0x1000) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"LZWDecoder: table full");
          goto LAB_00138ee4;
        }
        addToTable(this,c);
        iVar7 = uVar6 + 0x102 + (uint)this->code_change_delta;
        if (((iVar7 == 0x1ff) || (iVar7 == 0x7ff)) || (iVar7 == 0x3ff)) {
          this->code_size = this->code_size + 1;
        }
      }
      if (code < 0x100) {
        pPVar3 = (this->super_Pipeline).next_;
        local_29 = (uchar)code;
        (*pPVar3->_vptr_Pipeline[2])(pPVar3,&local_29,1);
      }
      else {
        pBVar1 = (this->table).super__Vector_base<Buffer,_std::allocator<Buffer>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->table).super__Vector_base<Buffer,_std::allocator<Buffer>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pBVar1 >> 3) <=
            (ulong)(code - 0x102)) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"Pl_LZWDecoder::handleCode: table overflow");
LAB_00138ee4:
          __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        this_00 = pBVar1 + (code - 0x102);
        pPVar3 = (this->super_Pipeline).next_;
        puVar4 = Buffer::getBuffer(this_00);
        sVar5 = Buffer::getSize(this_00);
        (*pPVar3->_vptr_Pipeline[2])(pPVar3,puVar4,sVar5);
      }
    }
    this->last_code = code;
  }
  return;
}

Assistant:

void
Pl_LZWDecoder::handleCode(unsigned int code)
{
    if (this->eod) {
        return;
    }

    if (code == 256) {
        if (!this->table.empty()) {
            QTC::TC("libtests", "Pl_LZWDecoder intermediate reset");
        }
        this->table.clear();
        this->code_size = 9;
    } else if (code == 257) {
        this->eod = true;
    } else {
        if (this->last_code != 256) {
            // Add to the table from last time.  New table entry would be what we read last plus the
            // first character of what we're reading now.
            unsigned char next_c = '\0';
            unsigned int table_size = QIntC::to_uint(table.size());
            if (code < 256) {
                // just read < 256; last time's next_c was code
                next_c = static_cast<unsigned char>(code);
            } else if (code > 257) {
                size_t idx = code - 258;
                if (idx > table_size) {
                    throw std::runtime_error("LZWDecoder: bad code received");
                } else if (idx == table_size) {
                    // The encoder would have just created this entry, so the first character of
                    // this entry would have been the same as the first character of the last entry.
                    QTC::TC("libtests", "Pl_LZWDecoder last was table size");
                    next_c = getFirstChar(this->last_code);
                } else {
                    next_c = getFirstChar(code);
                }
            }
            unsigned int new_idx = 258 + table_size;
            if (new_idx == 4096) {
                throw std::runtime_error("LZWDecoder: table full");
            }
            addToTable(next_c);
            unsigned int change_idx = new_idx + code_change_delta;
            if ((change_idx == 511) || (change_idx == 1023) || (change_idx == 2047)) {
                ++this->code_size;
            }
        }

        if (code < 256) {
            auto ch = static_cast<unsigned char>(code);
            next()->write(&ch, 1);
        } else {
            unsigned int idx = code - 258;
            if (idx >= table.size()) {
                throw std::runtime_error("Pl_LZWDecoder::handleCode: table overflow");
            }
            Buffer& b = table.at(idx);
            next()->write(b.getBuffer(), b.getSize());
        }
    }

    this->last_code = code;
}